

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractitemview.cpp
# Opt level: O0

void __thiscall QAbstractItemView::setCurrentIndex(QAbstractItemView *this,QModelIndex *index)

{
  long lVar1;
  bool bVar2;
  undefined4 uVar3;
  QAbstractItemViewPrivate *pQVar4;
  QItemSelectionModel *pQVar5;
  undefined8 in_RSI;
  QAbstractItemViewPrivate *in_RDI;
  long in_FS_OFFSET;
  QAbstractItemViewPrivate *d;
  SelectionFlags command;
  QModelIndex *in_stack_ffffffffffffffc8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar4 = d_func((QAbstractItemView *)0x8020df);
  bVar2 = ::QPointer::operator_cast_to_bool((QPointer<QItemSelectionModel> *)0x8020f5);
  if ((bVar2) &&
     ((bVar2 = QModelIndex::isValid((QModelIndex *)in_RDI), !bVar2 ||
      (bVar2 = QAbstractItemViewPrivate::isIndexEnabled(in_RDI,in_stack_ffffffffffffffc8), bVar2))))
  {
    uVar3 = (**(code **)(*(long *)&(in_RDI->super_QAbstractScrollAreaPrivate).super_QFramePrivate.
                                   super_QWidgetPrivate + 0x2e8))(in_RDI,in_RSI,0);
    pQVar5 = QPointer<QItemSelectionModel>::operator->((QPointer<QItemSelectionModel> *)0x802159);
    (**(code **)(*(long *)pQVar5 + 0x60))(pQVar5,in_RSI,uVar3);
    pQVar4->currentIndexSet = true;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QAbstractItemView::setCurrentIndex(const QModelIndex &index)
{
    Q_D(QAbstractItemView);
    if (d->selectionModel && (!index.isValid() || d->isIndexEnabled(index))) {
        QItemSelectionModel::SelectionFlags command = selectionCommand(index, nullptr);
        d->selectionModel->setCurrentIndex(index, command);
        d->currentIndexSet = true;
    }
}